

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

void Abc_NtkMiterAddCone(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkMiter,Abc_Obj_t *pRoot)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *p1;
  int i;
  Abc_Obj_t *pRoot_local;
  
  pRoot_local = pRoot;
  pAVar2 = Abc_AigConst1(pNtkMiter);
  pAVar3 = Abc_AigConst1(pNtk);
  (pAVar3->field_6).pCopy = pAVar2;
  p = Abc_NtkDfsNodes(pNtk,&pRoot_local,1);
  for (i = 0; i < p->nSize; i = i + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
    iVar1 = Abc_AigNodeIsAnd(pAVar2);
    if (iVar1 != 0) {
      pMan = (Abc_Aig_t *)pNtkMiter->pManFunc;
      pAVar3 = Abc_ObjChild0Copy(pAVar2);
      p1 = Abc_ObjChild1Copy(pAVar2);
      pAVar3 = Abc_AigAnd(pMan,pAVar3,p1);
      (pAVar2->field_6).pCopy = pAVar3;
    }
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkMiterAddCone( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkMiter, Abc_Obj_t * pRoot )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    // map the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkMiter);
    // perform strashing
    vNodes = Abc_NtkDfsNodes( pNtk, &pRoot, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        if ( Abc_AigNodeIsAnd(pNode) )
            pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
    Vec_PtrFree( vNodes );
}